

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O2

void NJDNode_add_orig(NJDNode *node,char *str)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  
  if (str != (char *)0x0) {
    __s = node->orig;
    if (__s == (char *)0x0) {
      __dest = strdup(str);
    }
    else {
      sVar1 = strlen(__s);
      sVar2 = strlen(str);
      __dest = (char *)calloc(sVar1 + sVar2 + 1,1);
      strcpy(__dest,__s);
      strcat(__dest,str);
      free(__s);
    }
    node->orig = __dest;
  }
  return;
}

Assistant:

void NJDNode_add_orig(NJDNode * node, const char *str)
{
   char *c;

   if (str != NULL) {
      if (node->orig == NULL) {
         node->orig = strdup(str);
      } else {
         c = (char *) calloc(strlen(node->orig) + strlen(str) + 1, sizeof(char));
         strcpy(c, node->orig);
         strcat(c, str);
         free(node->orig);
         node->orig = c;
      }
   }
}